

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O3

void Joy_GenerateButtonEvents(int oldbuttons,int newbuttons,int numbuttons,int base)

{
  uint uVar1;
  event_t ev;
  event_t local_48;
  
  if (oldbuttons != newbuttons) {
    local_48.type = '\0';
    local_48.subtype = '\0';
    local_48.data1 = 0;
    local_48.data2 = 0;
    local_48.data3 = 0;
    local_48.x = 0;
    local_48.y = 0;
    if (0 < numbuttons) {
      uVar1 = 1;
      do {
        if ((uVar1 & (oldbuttons ^ newbuttons)) != 0) {
          local_48.data1 = (SWORD)base;
          local_48.type = ((uVar1 & newbuttons) == 0) + '\x01';
          D_PostEvent(&local_48);
        }
        uVar1 = uVar1 * 2;
        base = base + 1;
        numbuttons = numbuttons + -1;
      } while (numbuttons != 0);
    }
  }
  return;
}

Assistant:

void Joy_GenerateButtonEvents(int oldbuttons, int newbuttons, int numbuttons, int base)
{
	int changed = oldbuttons ^ newbuttons;
	if (changed != 0)
	{
		event_t ev = { 0, 0, 0, 0, 0, 0, 0 };
		int mask = 1;
		for (int j = 0; j < numbuttons; mask <<= 1, ++j)
		{
			if (changed & mask)
			{
				ev.data1 = base + j;
				ev.type = (newbuttons & mask) ? EV_KeyDown : EV_KeyUp;
				D_PostEvent(&ev);
			}
		}
	}
}